

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

Result __thiscall
spectest::JSONParser::ParseKeyStringValue(JSONParser *this,char *key,string *out_string)

{
  bool bVar1;
  Result result;
  string *out_string_local;
  char *key_local;
  JSONParser *this_local;
  
  std::__cxx11::string::clear();
  result = ExpectKey(this,key);
  bVar1 = wabt::Failed(result);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    this_local._4_4_ = ParseString(this,out_string);
  }
  return (Result)this_local._4_4_;
}

Assistant:

wabt::Result JSONParser::ParseKeyStringValue(const char* key,
                                             std::string* out_string) {
  out_string->clear();
  EXPECT_KEY(key);
  return ParseString(out_string);
}